

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignalsImpl::Unregister(ValidationSignalsImpl *this,CValidationInterface *callbacks)

{
  _List_node_base *p_Var1;
  long lVar2;
  const_iterator __position;
  iterator __it;
  long in_FS_OFFSET;
  CValidationInterface *callbacks_local;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  callbacks_local = callbacks;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock2,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
             ,0x3c,false);
  __it = std::
         _Hashtable<CValidationInterface_*,_std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>,_std::__detail::_Select1st,_std::equal_to<CValidationInterface_*>,_std::hash<CValidationInterface_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->m_map)._M_h,&callbacks_local);
  if (__it.
      super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    __position._M_node =
         *(_List_node_base **)
          ((long)__it.
                 super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
                 ._M_cur + 0x10);
    p_Var1 = __position._M_node + 2;
    *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + -1;
    if (*(int *)&p_Var1->_M_next == 0) {
      std::__cxx11::
      list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>::
      erase(&this->m_list,__position);
    }
    std::
    _Hashtable<CValidationInterface_*,_std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_std::allocator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>_>,_std::__detail::_Select1st,_std::equal_to<CValidationInterface_*>,_std::hash<CValidationInterface_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->m_map)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
            ._M_cur);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        LOCK(m_mutex);
        auto it = m_map.find(callbacks);
        if (it != m_map.end()) {
            if (!--it->second->count) m_list.erase(it->second);
            m_map.erase(it);
        }
    }